

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read_next
          (basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor,error_code *ec)

{
  parse_state pVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  char_type *pcVar4;
  char_type *pcVar5;
  bool bVar6;
  span<const_char,_18446744073709551615UL> sVar7;
  
  (this->parser_).more_ = true;
  do {
    pcVar5 = (this->parser_).end_input_;
    pcVar4 = (this->parser_).input_ptr_;
    if (pcVar4 == pcVar5) {
      sVar7 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar4 = sVar7.data_;
      if (ec->_M_value != 0) {
        return;
      }
      if (sVar7.size_ == 0) {
        pcVar5 = (this->parser_).end_input_;
        pcVar4 = (this->parser_).input_ptr_;
      }
      else {
        (this->parser_).begin_input_ = pcVar4;
        pcVar5 = pcVar4 + sVar7.size_;
        (this->parser_).end_input_ = pcVar5;
        (this->parser_).input_ptr_ = pcVar4;
      }
    }
    pvVar2 = (this->source_).source_.end_;
    pvVar3 = (this->source_).source_.current_;
    basic_json_parser<char,_std::allocator<char>_>::parse_some_(&this->parser_,visitor,ec);
    bVar6 = ec->_M_value != 0;
    if ((pvVar2 == pvVar3 && pcVar5 == pcVar4) && !bVar6) {
      pVar1 = (this->parser_).state_;
      if (pVar1 == start) {
        this->done_ = true;
        return;
      }
      bVar6 = false;
      if ((pVar1 != accept) && (((this->parser_).done_ & 1U) == 0)) {
        std::error_code::operator=(ec,unexpected_eof);
        return;
      }
    }
    if (bVar6) {
      return;
    }
  } while (((this->parser_).more_ & 1U) != 0);
  return;
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                    if (JSONCONS_UNLIKELY(ec)) {return;}
                }
            }
            bool eof = parser_.source_exhausted() && source_.eof();
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            if (eof)
            {
                if (parser_.enter())
                {
                    done_ = true;
                    break;
                }
                else if (!parser_.accept())
                {
                    ec = json_errc::unexpected_eof;
                    return;
                }
            }
        }
    }